

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void ws_mask_frame(ws_frame *frame)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if (frame->masked == false) {
    uVar1 = nni_random();
    *(uint32_t *)frame->mask =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (frame->len != 0) {
      uVar2 = 0;
      do {
        frame->buf[uVar2] = frame->buf[uVar2] ^ frame->mask[(uint)uVar2 & 3];
        uVar2 = uVar2 + 1;
      } while (uVar2 < frame->len);
    }
    *(undefined4 *)(frame->head + frame->hlen) = *(undefined4 *)frame->mask;
    frame->hlen = frame->hlen + 4;
    frame->head[1] = frame->head[1] | 0x80;
    frame->masked = true;
  }
  return;
}

Assistant:

static void
ws_mask_frame(ws_frame *frame)
{
	uint32_t r;
	// frames sent by client need mask.
	if (frame->masked) {
		return;
	}
	r = nni_random();
	NNI_PUT32(frame->mask, r);
	for (size_t i = 0; i < frame->len; i++) {
		frame->buf[i] ^= frame->mask[i % 4];
	}
	memcpy(frame->head + frame->hlen, frame->mask, 4);
	frame->hlen += 4;
	frame->head[1] |= 0x80; // set masked bit
	frame->masked = true;
}